

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_get_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  byte *pbVar1;
  connectdata *pcVar2;
  FTP *pFVar3;
  long lVar4;
  curl_trc_feat *pcVar5;
  curl_off_t cVar6;
  CURLcode CVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  curl_off_t size;
  _Bool connected;
  curl_off_t local_30;
  char *local_28;
  
  pcVar2 = data->conn;
  pFVar3 = (data->req).p.ftp;
  if ((ftpcode != 0x96) && (ftpcode != 0x7d)) {
    if (ftpcode == 0x1c2 && instate == '\x1f') {
      pFVar3->transfer = PPTRANSFER_NONE;
      _ftp_state(data,'\0');
      return CURLE_OK;
    }
    Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
    CVar7 = CURLE_REMOTE_FILE_NOT_FOUND;
    if (instate != ' ') {
      CVar7 = CURLE_FTP_COULDNT_RETR_FILE;
    }
    if (ftpcode == 0x226) {
      return CVar7;
    }
    return CURLE_FTP_COULDNT_RETR_FILE;
  }
  local_30 = -1;
  if ((((instate == '\x1f') || (((data->state).field_0x7bf & 0x40) != 0)) ||
      (((data->set).field_0x898 & 8) != 0)) || (0 < pFVar3->downloadsize)) {
    lVar11 = pFVar3->downloadsize;
    cVar6 = lVar11;
    if (lVar11 < 0) {
      lVar11 = -1;
      cVar6 = local_30;
    }
  }
  else {
    pcVar9 = Curl_dyn_ptr(&(pcVar2->proto).ftpc.pp.recvbuf);
    pcVar10 = strstr(pcVar9," bytes");
    lVar11 = -1;
    cVar6 = local_30;
    if (pcVar10 != (char *)0x0) {
      pcVar12 = pcVar10 + -1;
      if (pcVar12 + ~(ulong)pcVar9 != (char *)0x0) {
        pcVar9 = pcVar9 + (2 - (long)pcVar10);
        do {
          if (*pcVar12 == '(') break;
          if (9 < (byte)(*pcVar12 - 0x30U)) goto LAB_0012cb9c;
          pcVar12 = pcVar12 + -1;
          pcVar9 = pcVar9 + 1;
        } while (pcVar9 != (char *)0x0);
      }
      local_28 = pcVar12 + 1;
      iVar8 = Curl_str_number(&local_28,&local_30,0x7fffffffffffffff);
      lVar11 = local_30;
      cVar6 = local_30;
      if (iVar8 != 0) {
        local_30 = 1;
        lVar11 = 1;
        cVar6 = local_30;
      }
    }
  }
LAB_0012cb9c:
  local_30 = cVar6;
  lVar4 = (data->req).maxdownload;
  if (lVar4 < 1 || lVar11 <= lVar4) {
    if ((instate != '\x1f') && (((data->state).field_0x7bf & 0x40) != 0)) {
      local_30 = -1;
    }
  }
  else {
    (data->req).size = lVar4;
    local_30 = lVar4;
  }
  if ((((data->set).field_0x897 & 0x40) != 0) &&
     ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
    Curl_infof(data,"Maxdownload = %ld");
  }
  if (((instate != '\x1f') && (((data->set).field_0x897 & 0x40) != 0)) &&
     ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
    Curl_infof(data,"Getting file with size: %ld",local_30);
  }
  (pcVar2->proto).ftpc.state_saved = instate;
  (pcVar2->proto).ftpc.retr_size_saved = local_30;
  if (((data->set).field_0x895 & 0x80) != 0) {
    CVar7 = Curl_conn_connect(data,1,false,(_Bool *)&local_28);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    if ((char)local_28 == '\0') {
      if ((((data->set).field_0x897 & 0x40) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"Data conn was not available immediately");
      }
      _ftp_state(data,'\0');
      pbVar1 = (byte *)((long)&pcVar2->proto + 0x11a);
      *pbVar1 = *pbVar1 | 0x20;
      CVar7 = ftp_check_ctrl_on_data_wait(data);
      return CVar7;
    }
    pbVar1 = (byte *)((long)&pcVar2->proto + 0x11a);
    *pbVar1 = *pbVar1 & 0xdf;
  }
  CVar7 = InitiateTransfer(data);
  return CVar7;
}

Assistant:

static CURLcode ftp_state_get_resp(struct Curl_easy *data,
                                   int ftpcode,
                                   ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;

  if((ftpcode == 150) || (ftpcode == 125)) {

    /*
      A;
      150 Opening BINARY mode data connection for /etc/passwd (2241
      bytes).  (ok, the file is being transferred)

      B:
      150 Opening ASCII mode data connection for /bin/ls

      C:
      150 ASCII data connection for /bin/ls (137.167.104.91,37445) (0 bytes).

      D:
      150 Opening ASCII mode data connection for [file] (0.0.0.0,0) (545 bytes)

      E:
      125 Data connection already open; Transfer starting. */

    curl_off_t size = -1; /* default unknown size */


    /*
     * It appears that there are FTP-servers that return size 0 for files when
     * SIZE is used on the file while being in BINARY mode. To work around
     * that (stupid) behavior, we attempt to parse the RETR response even if
     * the SIZE returned size zero.
     *
     * Debugging help from Salvatore Sorrentino on February 26, 2003.
     */

    if((instate != FTP_LIST) &&
       !data->state.prefer_ascii &&
       !data->set.ignorecl &&
       (ftp->downloadsize < 1)) {
      /*
       * It seems directory listings either do not show the size or often uses
       * size 0 anyway. ASCII transfers may cause that the transferred amount
       * of data is not the same as this line tells, why using this number in
       * those cases only confuses us.
       *
       * Example D above makes this parsing a little tricky */
      const char *bytes;
      char *buf = Curl_dyn_ptr(&conn->proto.ftpc.pp.recvbuf);
      bytes = strstr(buf, " bytes");
      if(bytes) {
        long in = (long)(--bytes-buf);
        /* this is a hint there is size information in there! ;-) */
        while(--in) {
          /* scan for the left parenthesis and break there */
          if('(' == *bytes)
            break;
          /* skip only digits */
          if(!ISDIGIT(*bytes)) {
            bytes = NULL;
            break;
          }
          /* one more estep backwards */
          bytes--;
        }
        /* if we have nothing but digits: */
        if(bytes) {
          ++bytes;
          /* get the number! */
          if(Curl_str_number(&bytes, &size, CURL_OFF_T_MAX))
            size = 1;
        }
      }
    }
    else if(ftp->downloadsize > -1)
      size = ftp->downloadsize;

    if(size > data->req.maxdownload && data->req.maxdownload > 0)
      size = data->req.size = data->req.maxdownload;
    else if((instate != FTP_LIST) && (data->state.prefer_ascii))
      size = -1; /* kludge for servers that understate ASCII mode file size */

    infof(data, "Maxdownload = %" FMT_OFF_T, data->req.maxdownload);

    if(instate != FTP_LIST)
      infof(data, "Getting file with size: %" FMT_OFF_T, size);

    /* FTP download: */
    conn->proto.ftpc.state_saved = instate;
    conn->proto.ftpc.retr_size_saved = size;

    if(data->set.ftp_use_port) {
      struct ftp_conn *ftpc = &conn->proto.ftpc;
      bool connected;

      result = Curl_conn_connect(data, SECONDARYSOCKET, FALSE, &connected);
      if(result)
        return result;

      if(!connected) {
        infof(data, "Data conn was not available immediately");
        ftp_state(data, FTP_STOP);
        ftpc->wait_data_conn = TRUE;
        return ftp_check_ctrl_on_data_wait(data);
      }
      ftpc->wait_data_conn = FALSE;
    }
    return InitiateTransfer(data);
  }
  else {
    if((instate == FTP_LIST) && (ftpcode == 450)) {
      /* simply no matching files in the dir listing */
      ftp->transfer = PPTRANSFER_NONE; /* do not download anything */
      ftp_state(data, FTP_STOP); /* this phase is over */
    }
    else {
      failf(data, "RETR response: %03d", ftpcode);
      return instate == FTP_RETR && ftpcode == 550 ?
        CURLE_REMOTE_FILE_NOT_FOUND :
        CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  return result;
}